

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListModel::insert(QListModel *this,int row,QStringList *labels)

{
  long lVar1;
  QListWidgetItem *pQVar2;
  ulong uVar3;
  QListWidget *pQVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long in_FS_OFFSET;
  QListWidgetItem *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (labels->d).size;
  uVar5 = (uint)uVar6;
  if (0 < (int)uVar5) {
    lVar1 = QMetaObject::cast((QObject *)&QListWidget::staticMetaObject);
    if ((lVar1 == 0) || (*(char *)(*(long *)(lVar1 + 8) + 0x5c0) != '\x01')) {
      if (row < 0) {
        iVar8 = 0;
      }
      else {
        uVar3 = (this->items).d.size;
        if ((uint)row <= uVar3) {
          uVar3 = (ulong)(uint)row;
        }
        iVar8 = (int)uVar3;
      }
      local_50 = (QListWidgetItem *)0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_50,iVar8);
      uVar3 = 1;
      if (1 < (int)uVar5) {
        uVar3 = uVar6 & 0xffffffff;
      }
      lVar7 = 0;
      lVar1 = (long)iVar8;
      do {
        pQVar2 = (QListWidgetItem *)operator_new(0x28);
        QListWidgetItem::QListWidgetItem
                  (pQVar2,(QString *)((long)&(((labels->d).ptr)->d).d + lVar7),(QListWidget *)0x0,0)
        ;
        pQVar2->d->theid = (int)lVar1;
        pQVar4 = (QListWidget *)QMetaObject::cast((QObject *)&QListWidget::staticMetaObject);
        pQVar2->view = pQVar4;
        local_50 = pQVar2;
        QtPrivate::QPodArrayOps<QListWidgetItem*>::emplace<QListWidgetItem*&>
                  ((QPodArrayOps<QListWidgetItem*> *)&this->items,lVar1,&local_50);
        QList<QListWidgetItem_*>::begin(&this->items);
        lVar7 = lVar7 + 0x18;
        lVar1 = lVar1 + 1;
      } while (uVar3 * 0x18 != lVar7);
      QAbstractItemModel::endInsertRows();
    }
    else {
      uVar6 = (ulong)(uVar5 & 0x7fffffff);
      lVar1 = 0;
      do {
        pQVar2 = (QListWidgetItem *)operator_new(0x28);
        QListWidgetItem::QListWidgetItem
                  (pQVar2,(QString *)((long)&(((labels->d).ptr)->d).d + lVar1),(QListWidget *)0x0,0)
        ;
        insert(this,row,pQVar2);
        lVar1 = lVar1 + 0x18;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModel::insert(int row, const QStringList &labels)
{
    const int count = labels.size();
    if (count <= 0)
        return;
    QListWidget *view = this->view();
    if (view && view->isSortingEnabled()) {
        // sorted insertion
        for (int i = 0; i < count; ++i) {
            QListWidgetItem *item = new QListWidgetItem(labels.at(i));
            insert(row, item);
        }
    } else {
        if (row < 0)
            row = 0;
        else if (row > items.size())
            row = items.size();
        beginInsertRows(QModelIndex(), row, row + count - 1);
        for (int i = 0; i < count; ++i) {
            QListWidgetItem *item = new QListWidgetItem(labels.at(i));
            item->d->theid = row;
            item->view = this->view();
            items.insert(row++, item);
        }
        endInsertRows();
    }
}